

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O3

REF_STATUS ref_oct_export_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_GRID ref_grid)

{
  REF_INT *pRVar1;
  REF_OCT pRVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  double dVar4;
  REF_STATUS RVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  REF_INT RVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  REF_DBL box [6];
  int local_f8;
  undefined8 local_f4;
  int local_ec;
  long local_e8;
  double local_e0;
  ulong local_d8;
  int local_cc;
  double local_c8;
  undefined8 uStack_c0;
  REF_DBL *local_b8;
  ulong local_b0;
  undefined8 local_a8;
  int local_a0;
  int local_9c;
  int local_98 [4];
  int iStack_88;
  long local_38;
  
  uVar11 = (ulong)(uint)node;
  uVar6 = node * 0x1b;
  lVar16 = (long)(int)uVar6;
  pRVar1 = ref_oct->nodes;
  local_b8 = bbox;
  if (ref_oct->children[node * 8] == -1) {
    if (pRVar1[lVar16 + 0x1a] == -1) {
      lVar8 = 0;
      do {
        if (pRVar1[lVar16 + lVar8] == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x336,"ref_oct_export_whole","expects to be set");
          goto LAB_0017879d;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      lVar8 = 8;
LAB_001785f4:
      if ((long)pRVar1[lVar16 + lVar8] == -1) goto code_r0x00178602;
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x339,
             "ref_oct_export_whole","implement 2-1",0xffffffffffffffff,(long)pRVar1[lVar16 + lVar8])
      ;
      ref_oct_tattle(ref_oct,node);
LAB_0017879d:
      uVar12 = 1;
      goto LAB_001787a3;
    }
    lVar8 = 0;
    do {
      if (pRVar1[lVar16 + lVar8] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x38e
               ,"ref_oct_export_steiner","expects to be set");
        uVar12 = 1;
        goto LAB_0017892d;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    local_e0 = SQRT((bbox[5] - bbox[4]) * (bbox[5] - bbox[4]) +
                    (bbox[3] - bbox[2]) * (bbox[3] - bbox[2]) +
                    (bbox[1] - *bbox) * (bbox[1] - *bbox)) * 0.1;
    lVar8 = 0;
    uVar12 = 0;
    local_d8 = uVar11;
    local_b0 = (ulong)uVar6;
    local_38 = lVar16;
LAB_00177e76:
    local_c8 = local_b8[lVar8] - ref_oct->bbox[lVar8];
    uStack_c0 = 0;
    local_e8 = lVar8;
    RVar5 = ref_oct_he2_qu2((REF_INT)lVar8,(REF_INT *)&local_a8);
    if (RVar5 != 0) {
      uVar12 = 1;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x396,
             "ref_oct_export_steiner",1,"qu2");
      goto LAB_0017892d;
    }
    if (local_c8 <= -local_c8) {
      local_c8 = -local_c8;
    }
    pRVar2 = (REF_OCT)ref_oct->nodes;
    RVar14 = (REF_INT)uVar11;
    if (*(int *)((long)pRVar2->bbox + (long)((int)local_b0 + iStack_88) * 4) == -1) {
      uVar6 = ref_oct_export_prism(pRVar2,RVar14,(REF_GRID)ref_grid->cell[9],(REF_INT *)&local_a8);
      if (uVar6 != 0) {
        pcVar13 = "whole quad pyr";
        uVar9 = 0x39a;
LAB_00178920:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9
               ,"ref_oct_export_steiner",(ulong)uVar6,pcVar13);
        uVar12 = (ulong)uVar6;
LAB_0017892d:
        pcVar13 = "whole";
        uVar9 = 0x3ff;
        goto LAB_0017894e;
      }
      if (local_e0 <= local_c8) goto LAB_00178587;
      lVar8 = local_e8 + 1;
      uVar6 = ref_oct_export_qua((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[6],
                                 (REF_INT *)&local_a8,(REF_INT)lVar8);
      uVar11 = local_d8;
      if (uVar6 != 0) {
        pcVar13 = "whole quad boundary qua";
        uVar9 = 0x39e;
        goto LAB_00178920;
      }
    }
    else {
      bVar18 = true;
      lVar8 = 0;
      do {
        while (!bVar18) {
          lVar8 = lVar8 + 1;
          bVar18 = false;
          if (lVar8 == 9) goto LAB_00177f76;
        }
        iVar15 = *(int *)((long)pRVar2->bbox + (*(int *)((long)&local_a8 + lVar8 * 4) + lVar16) * 4)
        ;
        bVar18 = iVar15 != -1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 9);
      if (iVar15 == -1) {
LAB_00177f76:
        local_cc = (int)local_e8 + 1;
        uVar11 = 0;
        do {
          uVar17 = uVar11 + 1;
          uVar10 = uVar17 & 0xffffffff;
          if (uVar11 == 3) {
            uVar10 = 0;
          }
          pRVar2 = (REF_OCT)ref_oct->nodes;
          local_f8 = *(int *)((long)&local_a8 + uVar11 * 4);
          RVar14 = (REF_INT)local_d8;
          if (*(int *)((long)pRVar2->bbox + (long)((int)local_b0 + local_98[uVar11]) * 4) != -1) {
            local_f4 = CONCAT44(iStack_88,local_98[uVar11]);
            uVar6 = ref_oct_export_tet(pRVar2,RVar14,(REF_GRID)ref_grid->cell[8],&local_f8);
            if (uVar6 == 0) {
              if ((local_e0 <= local_c8) ||
                 (uVar6 = ref_oct_export_tri((REF_OCT)ref_oct->nodes,(REF_INT)local_d8,
                                             (REF_GRID)ref_grid->cell[3],&local_f8,local_cc),
                 uVar6 == 0)) {
                local_f8 = local_98[uVar11];
                local_f4 = CONCAT44(iStack_88,*(undefined4 *)((long)&local_a8 + uVar10 * 4));
                RVar14 = (REF_INT)local_d8;
                uVar6 = ref_oct_export_tet((REF_OCT)ref_oct->nodes,RVar14,
                                           (REF_GRID)ref_grid->cell[8],&local_f8);
                if (uVar6 != 0) {
                  uVar9 = 0x3eb;
                  pcVar13 = "tri m1";
                  goto LAB_001783be;
                }
                if ((local_c8 < local_e0) &&
                   (uVar6 = ref_oct_export_tri((REF_OCT)ref_oct->nodes,RVar14,
                                               (REF_GRID)ref_grid->cell[3],&local_f8,local_cc),
                   uVar6 != 0)) {
                  uVar9 = 0x3ef;
                  goto LAB_001783ad;
                }
                goto LAB_00178118;
              }
              uVar9 = 999;
              uVar11 = (ulong)uVar6;
              pcVar13 = "boundary tri";
            }
            else {
              uVar9 = 0x3e3;
              uVar11 = (ulong)uVar6;
              pcVar13 = "tri 0m";
            }
LAB_0017830f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   uVar9,"ref_oct_export_steiner",uVar11,pcVar13);
            iVar15 = 1;
            uVar12 = (ulong)uVar6;
            lVar16 = local_38;
            goto LAB_00178573;
          }
          local_f4 = CONCAT44(iStack_88,*(undefined4 *)((long)&local_a8 + uVar10 * 4));
          uVar6 = ref_oct_export_tet(pRVar2,RVar14,(REF_GRID)ref_grid->cell[8],&local_f8);
          if (uVar6 != 0) {
            uVar9 = 0x3da;
            uVar11 = (ulong)uVar6;
            pcVar13 = "tri 01";
            goto LAB_0017830f;
          }
          if ((local_c8 < local_e0) &&
             (uVar6 = ref_oct_export_tri((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[3],
                                         &local_f8,local_cc), uVar6 != 0)) {
            uVar9 = 0x3de;
LAB_001783ad:
            pcVar13 = "boundary tri";
LAB_001783be:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   uVar9,"ref_oct_export_steiner",(ulong)uVar6,pcVar13);
            iVar15 = 1;
            uVar12 = (ulong)uVar6;
            lVar16 = local_38;
            goto LAB_00178573;
          }
LAB_00178118:
          uVar11 = uVar17;
        } while (uVar17 != 4);
        iVar15 = 7;
        lVar16 = local_38;
      }
      else {
        local_f8 = (int)local_a8;
        local_f4 = CONCAT44(iStack_88,local_98[0]);
        local_ec = local_98[3];
        uVar6 = ref_oct_export_prism(pRVar2,RVar14,(REF_GRID)ref_grid->cell[9],&local_f8);
        if (uVar6 == 0) {
          if ((local_e0 <= local_c8) ||
             (uVar6 = ref_oct_export_qua((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[6],
                                         &local_f8,(int)local_e8 + 1), uVar6 == 0)) {
            local_f8 = local_a8._4_4_;
            local_f4 = CONCAT44(iStack_88,local_98[1]);
            local_ec = local_98[0];
            uVar6 = ref_oct_export_prism
                              ((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[9],&local_f8)
            ;
            if (uVar6 != 0) {
              uVar9 = 0x3b4;
              uVar11 = (ulong)uVar6;
              pcVar13 = "qua 1/4";
              goto LAB_0017855e;
            }
            if ((local_e0 <= local_c8) ||
               (uVar6 = ref_oct_export_qua((REF_OCT)ref_oct->nodes,RVar14,
                                           (REF_GRID)ref_grid->cell[6],&local_f8,(int)local_e8 + 1),
               uVar6 == 0)) {
              local_f8 = local_a0;
              local_f4 = CONCAT44(iStack_88,local_98[2]);
              local_ec = local_98[1];
              uVar6 = ref_oct_export_prism
                                ((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[9],
                                 &local_f8);
              if (uVar6 != 0) {
                uVar9 = 0x3bd;
                uVar11 = (ulong)uVar6;
                pcVar13 = "qua 2/4";
                goto LAB_0017855e;
              }
              if ((local_e0 <= local_c8) ||
                 (uVar6 = ref_oct_export_qua((REF_OCT)ref_oct->nodes,RVar14,
                                             (REF_GRID)ref_grid->cell[6],&local_f8,(int)local_e8 + 1
                                            ), uVar6 == 0)) {
                local_f8 = local_9c;
                local_f4 = CONCAT44(iStack_88,local_98[3]);
                local_ec = local_98[2];
                uVar6 = ref_oct_export_prism
                                  ((REF_OCT)ref_oct->nodes,RVar14,(REF_GRID)ref_grid->cell[9],
                                   &local_f8);
                if (uVar6 != 0) {
                  uVar9 = 0x3c6;
                  uVar11 = (ulong)uVar6;
                  pcVar13 = "qua 3/4";
                  goto LAB_0017855e;
                }
                iVar15 = 7;
                if ((local_e0 <= local_c8) ||
                   (uVar6 = ref_oct_export_qua((REF_OCT)ref_oct->nodes,(REF_INT)local_d8,
                                               (REF_GRID)ref_grid->cell[6],&local_f8,
                                               (int)local_e8 + 1), uVar6 == 0)) goto LAB_00178573;
                uVar9 = 0x3ca;
              }
              else {
                uVar9 = 0x3c1;
              }
            }
            else {
              uVar9 = 0x3b8;
            }
          }
          else {
            uVar9 = 0x3af;
          }
          uVar11 = (ulong)uVar6;
          pcVar13 = "whole quad boundary qua";
        }
        else {
          uVar9 = 0x3ab;
          uVar11 = (ulong)uVar6;
          pcVar13 = "qua 0/4";
        }
LAB_0017855e:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9
               ,"ref_oct_export_steiner",uVar11,pcVar13);
        iVar15 = 1;
        uVar12 = (ulong)uVar6;
      }
LAB_00178573:
      uVar11 = local_d8;
      if (iVar15 != 7) {
        if ((int)uVar12 == 0) {
          return 0;
        }
        goto LAB_0017892d;
      }
LAB_00178587:
      lVar8 = local_e8 + 1;
    }
    if (lVar8 == 6) {
      return 0;
    }
    goto LAB_00177e76;
  }
  lVar8 = 0;
  do {
    if ((long)pRVar1[lVar16 + lVar8] != -1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x406,
             "ref_oct_export_node","interor node with grid node",0xffffffffffffffff,
             (long)pRVar1[lVar16 + lVar8]);
      return 1;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1b);
  lVar16 = 0;
  while( true ) {
    RVar5 = ref_oct_child_bbox(local_b8,(REF_INT)lVar16,(REF_DBL *)&local_a8);
    if (RVar5 != 0) {
      pcVar13 = "bbox";
      RVar5 = 1;
      uVar9 = 0x409;
      uVar12 = 1;
      goto LAB_00178951;
    }
    uVar6 = ref_oct_export_node(ref_oct,ref_oct->children[node * 8 + lVar16],(REF_DBL *)&local_a8,
                                ref_grid);
    if (uVar6 != 0) break;
    lVar16 = lVar16 + 1;
    if (lVar16 == 8) {
      return 0;
    }
  }
  uVar12 = (ulong)uVar6;
  pcVar13 = "recurse";
  uVar9 = 0x40d;
  goto LAB_0017894e;
code_r0x00178602:
  lVar8 = lVar8 + 1;
  if (lVar8 == 0x1b) goto code_r0x0017860b;
  goto LAB_001785f4;
code_r0x0017860b:
  lVar8 = 0;
  do {
    *(REF_INT *)((long)&local_a8 + lVar8 * 4) = pRVar1[lVar16 + lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  uVar7 = ref_cell_add(ref_grid->cell[0xb],(REF_INT *)&local_a8,&local_f8);
  if (uVar7 == 0) {
    ref_cell = ref_grid->cell[6];
    dVar19 = SQRT((local_b8[5] - local_b8[4]) * (local_b8[5] - local_b8[4]) +
                  (local_b8[3] - local_b8[2]) * (local_b8[3] - local_b8[2]) +
                  (local_b8[1] - *local_b8) * (local_b8[1] - *local_b8)) * 0.1;
    lVar16 = 0;
    local_c8 = dVar19;
    do {
      dVar4 = local_b8[lVar16] - ref_oct->bbox[lVar16];
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      if (dVar4 < dVar19) {
        pRVar1 = ref_oct->nodes;
        pRVar3 = ref_grid->cell[0xb]->f2n;
        lVar8 = 0;
        do {
          iVar15 = pRVar3[lVar16 * 4 + lVar8];
          *(int *)((long)&local_a8 + lVar8 * 4) = iVar15;
          *(REF_INT *)((long)&local_a8 + lVar8 * 4) = pRVar1[(int)(iVar15 + uVar6)];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        *(int *)((long)&local_a8 + (long)ref_cell->node_per * 4) = (int)lVar16 + 1;
        uVar7 = ref_cell_add(ref_cell,(REF_INT *)&local_a8,&local_f8);
        dVar19 = local_c8;
        if (uVar7 != 0) {
          pcVar13 = "add quad";
          uVar9 = 0x348;
          goto LAB_0017865f;
        }
      }
      lVar16 = lVar16 + 1;
      if (lVar16 == 6) {
        return 0;
      }
    } while( true );
  }
  pcVar13 = "add hex";
  uVar9 = 0x33c;
LAB_0017865f:
  uVar12 = (ulong)uVar7;
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9,
         "ref_oct_export_whole",uVar12,pcVar13);
LAB_001787a3:
  pcVar13 = "whole";
  uVar9 = 0x3fd;
LAB_0017894e:
  RVar5 = (REF_STATUS)uVar12;
LAB_00178951:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar9,
         "ref_oct_export_node",uVar12,pcVar13);
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_node(REF_OCT ref_oct, REF_INT node,
                                              REF_DBL *bbox,
                                              REF_GRID ref_grid) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    if (REF_EMPTY == ref_oct_c2n(ref_oct, 26, node)) {
      RSS(ref_oct_export_whole(ref_oct, node, bbox, ref_grid), "whole");
    } else {
      RSS(ref_oct_export_steiner(ref_oct, node, bbox, ref_grid), "whole");
    }
  } else {
    REF_INT i;
    REF_INT child_index;
    for (i = 0; i < 27; i++)
      REIS(REF_EMPTY, ref_oct_c2n(ref_oct, i, node),
           "interor node with grid node");
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_export_node(ref_oct,
                              ref_oct_child(ref_oct, child_index, node), box,
                              ref_grid),
          "recurse");
    }
  }
  return REF_SUCCESS;
}